

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OgreStructs.cpp
# Opt level: O2

Bone * __thiscall Assimp::Ogre::Skeleton::BoneByName(Skeleton *this,string *name)

{
  __type _Var1;
  pointer ppBVar2;
  
  ppBVar2 = (this->bones).
            super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  while( true ) {
    if (ppBVar2 ==
        (this->bones).
        super__Vector_base<Assimp::Ogre::Bone_*,_std::allocator<Assimp::Ogre::Bone_*>_>._M_impl.
        super__Vector_impl_data._M_finish) {
      return (Bone *)0x0;
    }
    _Var1 = std::operator==(&(*ppBVar2)->name,name);
    if (_Var1) break;
    ppBVar2 = ppBVar2 + 1;
  }
  return *ppBVar2;
}

Assistant:

Bone *Skeleton::BoneByName(const std::string &name) const
{
    for(BoneList::const_iterator iter = bones.begin(); iter != bones.end(); ++iter)
    {
        if ((*iter)->name == name)
            return (*iter);
    }
    return 0;
}